

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O1

bool __thiscall
OpenMD::SelectionCompiler::lookingAtInteger(SelectionCompiler *this,bool allowNegative)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  allocator<char> local_49;
  string local_48;
  long *local_28 [2];
  long local_18 [2];
  
  iVar1 = this->cchScript;
  iVar2 = this->ichToken;
  if (iVar2 != iVar1) {
    iVar6 = iVar2;
    if (allowNegative) {
      iVar6 = (uint)((this->script)._M_dataplus._M_p[iVar2] == '-') + iVar2;
    }
    iVar5 = iVar6;
    if (iVar6 < iVar1) {
      pcVar7 = (this->script)._M_dataplus._M_p + iVar6;
      iVar4 = iVar6;
      do {
        iVar5 = iVar4;
        if (9 < (int)*pcVar7 - 0x30U) break;
        iVar4 = iVar4 + 1;
        pcVar7 = pcVar7 + 1;
        iVar5 = iVar1;
      } while (iVar1 != iVar4);
    }
    if (iVar6 != iVar5) {
      this->cchToken = iVar5 - iVar2;
      std::__cxx11::string::substr((ulong)local_28,(ulong)&this->script);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,(char *)local_28[0],&local_49);
      bVar3 = isInteger(&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      if (local_28[0] == local_18) {
        return bVar3;
      }
      operator_delete(local_28[0],local_18[0] + 1);
      return bVar3;
    }
  }
  return false;
}

Assistant:

bool SelectionCompiler::lookingAtInteger(bool allowNegative) {
    if (ichToken == cchScript) { return false; }
    int ichT = ichToken;
    if (allowNegative && script[ichToken] == '-') { ++ichT; }
    int ichBeginDigits = ichT;
    while (ichT < cchScript && std::isdigit(script[ichT])) {
      ++ichT;
    }
    if (ichBeginDigits == ichT) { return false; }
    cchToken = ichT - ichToken;
    return isInteger(script.substr(ichToken, cchToken).c_str());
  }